

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O1

bool Fverb::parameter_is_logarithmic(uint index)

{
  return (bool)((byte)(0x10c >> ((byte)index & 0x1f)) & index < 9);
}

Assistant:

bool Fverb::parameter_is_logarithmic(unsigned index) noexcept
{
    switch (index) {

    case 2:
        return true;

    case 3:
        return true;

    case 8:
        return true;

    default:
        return false;
    }
}